

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O3

unique_ptr<named_fstream,_std::default_delete<named_fstream>_> __thiscall
memory::make_unique<named_fstream,char_const(&)[35]>(memory *this,char (*args) [35])

{
  named_fstream *pnVar1;
  size_t sVar2;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  pnVar1 = (named_fstream *)operator_new(0x248);
  local_40[0] = local_30;
  sVar2 = strlen(*args);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,args,*args + sVar2);
  named_fstream::named_fstream(pnVar1,local_40,0x3c);
  *(named_fstream **)this = pnVar1;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return (__uniq_ptr_data<named_fstream,_std::default_delete<named_fstream>,_true,_true>)
         (__uniq_ptr_data<named_fstream,_std::default_delete<named_fstream>,_true,_true>)this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args)
    {
        return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
    }